

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O3

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *puVar5;
  BYTE *pBVar6;
  undefined8 *puVar7;
  uint uVar8;
  uint uVar9;
  ZSTD_longLengthType_e ZVar10;
  BYTE *pBVar11;
  U32 *pUVar12;
  U32 *pUVar13;
  BYTE *pBVar14;
  bool bVar15;
  undefined8 uVar16;
  ulong *puVar17;
  ulong *puVar18;
  seqDef *psVar19;
  byte bVar20;
  byte bVar21;
  int *piVar22;
  uint uVar23;
  ulong uVar24;
  ulong *puVar25;
  int iVar26;
  U32 UVar27;
  ulong *puVar28;
  ulong *puVar29;
  uint uVar30;
  uint uVar31;
  ulong uVar32;
  ulong uVar33;
  uint uVar34;
  ulong *puVar35;
  long lVar36;
  uint uVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  long lVar42;
  ulong uVar43;
  int iVar44;
  BYTE *litEnd_1;
  BYTE *litEnd;
  ulong *puVar45;
  ulong uVar46;
  ulong *puVar47;
  BYTE *pInLoopLimit_3;
  BYTE *litLimit_w;
  BYTE *iend;
  BYTE *pInLoopLimit;
  BYTE *pInLoopLimit_2;
  BYTE *prefixLowest;
  BYTE *base;
  U32 *hashLong;
  BYTE *ilimit;
  U32 *hashSmall;
  U32 prefixLowestIndex;
  ulong local_e0;
  ulong local_88;
  
  pBVar11 = (ms->window).base;
  puVar5 = (ulong *)((long)src + srcSize);
  iVar44 = (int)pBVar11;
  iVar26 = (int)puVar5 - iVar44;
  uVar34 = (ms->window).dictLimit;
  uVar37 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar23 = iVar26 - uVar37;
  if (iVar26 - uVar34 <= uVar37) {
    uVar23 = uVar34;
  }
  if (ms->loadedDictEnd != 0) {
    uVar23 = uVar34;
  }
  puVar28 = (ulong *)(pBVar11 + uVar23);
  puVar45 = (ulong *)((long)src + (ulong)(puVar28 == (ulong *)src));
  iVar26 = (int)puVar45 - iVar44;
  uVar30 = iVar26 - uVar37;
  if (iVar26 - uVar34 <= uVar37) {
    uVar30 = uVar34;
  }
  if (ms->loadedDictEnd != 0) {
    uVar30 = uVar34;
  }
  uVar34 = rep[1];
  uVar30 = iVar26 - uVar30;
  uVar37 = uVar34;
  if (uVar30 < uVar34) {
    uVar37 = 0;
  }
  uVar46 = (ulong)uVar37;
  puVar17 = (ulong *)((long)src + (srcSize - 8));
  uVar8 = *rep;
  uVar38 = 0;
  if (uVar8 <= uVar30) {
    uVar38 = uVar8;
  }
  puVar29 = (ulong *)((long)src + (ulong)(puVar28 == (ulong *)src) + 1);
  uVar9 = (ms->cParams).minMatch;
  pUVar12 = ms->hashTable;
  pUVar13 = ms->chainTable;
  if (uVar9 == 5) {
    if (puVar29 <= puVar17) {
      uVar37 = (ms->cParams).hashLog;
      if ((uVar37 < 0x21) && (uVar9 = (ms->cParams).chainLog, uVar9 < 0x21)) {
        bVar20 = 0x40 - (char)uVar37;
        bVar21 = 0x40 - (char)uVar9;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
LAB_001c4994:
        uVar37 = (uint)uVar46;
        uVar33 = *puVar45 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        puVar25 = puVar45 + 0x20;
        uVar43 = (ulong)pUVar12[uVar33];
        puVar35 = (ulong *)(pBVar11 + uVar43);
        lVar42 = -(ulong)uVar38;
        uVar39 = 1;
        uVar40 = *puVar45;
        while( true ) {
          puVar18 = puVar29;
          uVar24 = uVar40 * -0x30e4432345000000 >> (bVar21 & 0x3f);
          uVar9 = pUVar13[uVar24];
          uVar41 = (ulong)uVar9;
          UVar27 = (int)puVar45 - iVar44;
          pUVar13[uVar24] = UVar27;
          pUVar12[uVar33] = UVar27;
          if ((uVar38 != 0) && (*(int *)((long)puVar45 + lVar42 + 1) == *(int *)((long)puVar45 + 1))
             ) {
            puVar29 = (ulong *)((long)puVar45 + 5);
            puVar35 = (ulong *)((long)puVar45 + lVar42 + 5);
            puVar25 = puVar29;
            if (puVar1 <= puVar29) goto LAB_001c4cb4;
            if (*puVar35 != *puVar29) {
              uVar33 = *puVar29 ^ *puVar35;
              uVar40 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = uVar40 >> 3 & 0x1fffffff;
              goto LAB_001c4cfe;
            }
            lVar36 = 0;
            goto LAB_001c4aea;
          }
          uVar24 = *puVar18;
          uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          if ((uVar23 < (uint)uVar43) && (*puVar35 == uVar40)) {
            puVar29 = puVar45 + 1;
            puVar25 = puVar35 + 1;
            puVar47 = puVar29;
            if (puVar1 <= puVar29) goto LAB_001c4e90;
            if (*puVar25 != *puVar29) {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_88 = uVar46 >> 3 & 0x1fffffff;
              goto LAB_001c4edf;
            }
            lVar42 = 0;
            goto LAB_001c4b57;
          }
          uVar43 = (ulong)pUVar12[uVar33];
          puVar35 = (ulong *)(pBVar11 + uVar43);
          if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar11 + uVar41), *piVar22 == (int)*puVar45))
          break;
          if (puVar25 <= puVar18) {
            uVar39 = uVar39 + 1;
            puVar25 = puVar25 + 0x20;
          }
          puVar29 = (ulong *)((long)puVar18 + uVar39);
          uVar40 = uVar24;
          puVar45 = puVar18;
          if (puVar17 < (ulong *)((long)puVar18 + uVar39)) goto LAB_001c6157;
        }
        if ((uVar23 < pUVar12[uVar33]) && (*puVar35 == uVar24)) {
          puVar45 = puVar18 + 1;
          puVar29 = puVar35 + 1;
          puVar25 = puVar45;
          if (puVar45 < puVar1) {
            if (*puVar29 == *puVar45) {
              lVar42 = 0;
              do {
                puVar29 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                if (puVar1 <= puVar29) {
                  puVar29 = (ulong *)(pBVar11 + lVar42 + uVar43 + 0x10);
                  puVar25 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                  goto LAB_001c5013;
                }
                lVar36 = lVar42 + uVar43 + 0x10;
                uVar46 = *puVar29;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_88 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar45 ^ *puVar29;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_88 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c5013:
            if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar25 < puVar5) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
            }
            local_88 = (long)puVar25 - (long)puVar45;
          }
          local_88 = local_88 + 8;
          uVar24 = (long)puVar18 - (long)puVar35;
          puVar45 = puVar18;
          if (src < puVar18) {
            puVar45 = (ulong *)(pBVar11 + (uVar43 - 1));
            puVar29 = (ulong *)((long)puVar18 + -1);
            do {
              if ((char)*puVar29 != (char)*puVar45) {
                puVar45 = (ulong *)((long)puVar29 + 1);
                goto LAB_001c50b1;
              }
              local_88 = local_88 + 1;
              puVar25 = (ulong *)((long)puVar29 + -1);
            } while ((src < puVar29) &&
                    (bVar15 = puVar28 < puVar45, puVar45 = (ulong *)((long)puVar45 + -1),
                    puVar29 = puVar25, bVar15));
LAB_001c509c:
            puVar45 = (ulong *)((long)puVar25 + 1);
          }
        }
        else {
          puVar29 = (ulong *)((long)puVar45 + 4);
          puVar25 = (ulong *)(piVar22 + 1);
          puVar35 = puVar29;
          if (puVar29 < puVar1) {
            if (*puVar25 == *puVar29) {
              lVar42 = 0;
              do {
                puVar25 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                if (puVar1 <= puVar25) {
                  puVar25 = (ulong *)(pBVar11 + lVar42 + uVar41 + 0xc);
                  puVar35 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                  goto LAB_001c4f55;
                }
                lVar36 = lVar42 + uVar41 + 0xc;
                uVar46 = *puVar25;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_88 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_88 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c4f55:
            if ((puVar35 < puVar2) && ((int)*puVar25 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((puVar35 < puVar3) && ((short)*puVar25 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (puVar35 < puVar5) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar25 == (char)*puVar35));
            }
            local_88 = (long)puVar35 - (long)puVar29;
          }
          local_88 = local_88 + 4;
          uVar24 = (long)puVar45 - (long)piVar22;
          if (src < puVar45) {
            puVar45 = (ulong *)((long)puVar45 + -1);
            puVar29 = (ulong *)(pBVar11 + (uVar41 - 1));
            do {
              if ((char)*puVar45 != (char)*puVar29) {
                puVar45 = (ulong *)((long)puVar45 + 1);
                goto LAB_001c50b1;
              }
              local_88 = local_88 + 1;
              puVar25 = (ulong *)((long)puVar45 + -1);
            } while ((src < puVar45) &&
                    (bVar15 = puVar28 < puVar29, puVar45 = puVar25,
                    puVar29 = (ulong *)((long)puVar29 + -1), bVar15));
            goto LAB_001c509c;
          }
        }
        goto LAB_001c50b1;
      }
      goto LAB_001c6274;
    }
  }
  else if (uVar9 == 6) {
    if (puVar29 <= puVar17) {
      uVar37 = (ms->cParams).hashLog;
      if ((uVar37 < 0x21) && (uVar9 = (ms->cParams).chainLog, uVar9 < 0x21)) {
        bVar20 = 0x40 - (char)uVar37;
        bVar21 = 0x40 - (char)uVar9;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
LAB_001c3d50:
        uVar37 = (uint)uVar46;
        uVar33 = *puVar45 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        puVar25 = puVar45 + 0x20;
        uVar43 = (ulong)pUVar12[uVar33];
        puVar35 = (ulong *)(pBVar11 + uVar43);
        lVar42 = -(ulong)uVar38;
        uVar39 = 1;
        uVar40 = *puVar45;
        while( true ) {
          puVar18 = puVar29;
          uVar24 = uVar40 * -0x30e4432340650000 >> (bVar21 & 0x3f);
          uVar9 = pUVar13[uVar24];
          uVar41 = (ulong)uVar9;
          UVar27 = (int)puVar45 - iVar44;
          pUVar13[uVar24] = UVar27;
          pUVar12[uVar33] = UVar27;
          if ((uVar38 != 0) && (*(int *)((long)puVar45 + lVar42 + 1) == *(int *)((long)puVar45 + 1))
             ) {
            puVar29 = (ulong *)((long)puVar45 + 5);
            puVar35 = (ulong *)((long)puVar45 + lVar42 + 5);
            puVar25 = puVar29;
            if (puVar1 <= puVar29) goto LAB_001c4077;
            if (*puVar35 != *puVar29) {
              uVar33 = *puVar29 ^ *puVar35;
              uVar40 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = uVar40 >> 3 & 0x1fffffff;
              goto LAB_001c40c1;
            }
            lVar36 = 0;
            goto LAB_001c3eb2;
          }
          uVar24 = *puVar18;
          uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          if ((uVar23 < (uint)uVar43) && (*puVar35 == uVar40)) {
            puVar29 = puVar45 + 1;
            puVar25 = puVar35 + 1;
            puVar47 = puVar29;
            if (puVar1 <= puVar29) goto LAB_001c4258;
            if (*puVar25 != *puVar29) {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
              goto LAB_001c42ac;
            }
            lVar42 = 0;
            goto LAB_001c3f1a;
          }
          uVar43 = (ulong)pUVar12[uVar33];
          puVar35 = (ulong *)(pBVar11 + uVar43);
          if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar11 + uVar41), *piVar22 == (int)*puVar45))
          break;
          if (puVar25 <= puVar18) {
            uVar39 = uVar39 + 1;
            puVar25 = puVar25 + 0x20;
          }
          puVar29 = (ulong *)((long)puVar18 + uVar39);
          uVar40 = uVar24;
          puVar45 = puVar18;
          if (puVar17 < (ulong *)((long)puVar18 + uVar39)) goto LAB_001c6157;
        }
        if ((uVar23 < pUVar12[uVar33]) && (*puVar35 == uVar24)) {
          puVar45 = puVar18 + 1;
          puVar29 = puVar35 + 1;
          puVar25 = puVar45;
          if (puVar45 < puVar1) {
            if (*puVar29 == *puVar45) {
              lVar42 = 0;
              do {
                puVar29 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                if (puVar1 <= puVar29) {
                  puVar29 = (ulong *)(pBVar11 + lVar42 + uVar43 + 0x10);
                  puVar25 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                  goto LAB_001c43e7;
                }
                lVar36 = lVar42 + uVar43 + 0x10;
                uVar46 = *puVar29;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_e0 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar45 ^ *puVar29;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c43e7:
            if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar25 < puVar5) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
            }
            local_e0 = (long)puVar25 - (long)puVar45;
          }
          local_e0 = local_e0 + 8;
          uVar24 = (long)puVar18 - (long)puVar35;
          puVar45 = puVar18;
          if (src < puVar18) {
            puVar29 = (ulong *)(pBVar11 + (uVar43 - 1));
            do {
              puVar25 = (ulong *)((long)puVar45 + -1);
              if ((*(char *)puVar25 != (char)*puVar29) ||
                 (local_e0 = local_e0 + 1, puVar45 = puVar25, puVar25 <= src)) break;
              bVar15 = puVar28 < puVar29;
              puVar29 = (ulong *)((long)puVar29 + -1);
            } while (bVar15);
          }
        }
        else {
          puVar29 = (ulong *)((long)puVar45 + 4);
          puVar25 = (ulong *)(piVar22 + 1);
          puVar35 = puVar29;
          if (puVar29 < puVar1) {
            if (*puVar25 == *puVar29) {
              lVar42 = 0;
              do {
                puVar25 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                if (puVar1 <= puVar25) {
                  puVar25 = (ulong *)(pBVar11 + lVar42 + uVar41 + 0xc);
                  puVar35 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                  goto LAB_001c4322;
                }
                lVar36 = lVar42 + uVar41 + 0xc;
                uVar46 = *puVar25;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_e0 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c4322:
            if ((puVar35 < puVar2) && ((int)*puVar25 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((puVar35 < puVar3) && ((short)*puVar25 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (puVar35 < puVar5) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar25 == (char)*puVar35));
            }
            local_e0 = (long)puVar35 - (long)puVar29;
          }
          local_e0 = local_e0 + 4;
          uVar24 = (long)puVar45 - (long)piVar22;
          if (src < puVar45) {
            puVar29 = (ulong *)(pBVar11 + (uVar41 - 1));
            do {
              puVar25 = (ulong *)((long)puVar45 + -1);
              if ((*(char *)puVar25 != (char)*puVar29) ||
                 (local_e0 = local_e0 + 1, puVar45 = puVar25, puVar25 <= src)) break;
              bVar15 = puVar28 < puVar29;
              puVar29 = (ulong *)((long)puVar29 + -1);
            } while (bVar15);
          }
        }
        goto LAB_001c448a;
      }
      goto LAB_001c6274;
    }
  }
  else if (uVar9 == 7) {
    if (puVar29 <= puVar17) {
      uVar37 = (ms->cParams).hashLog;
      if ((uVar37 < 0x21) && (uVar9 = (ms->cParams).chainLog, uVar9 < 0x21)) {
        bVar20 = 0x40 - (char)uVar37;
        bVar21 = 0x40 - (char)uVar9;
        puVar1 = (ulong *)((long)puVar5 - 7);
        puVar2 = (ulong *)((long)puVar5 - 3);
        puVar3 = (ulong *)((long)puVar5 - 1);
        puVar4 = puVar5 + -4;
LAB_001c3111:
        uVar37 = (uint)uVar46;
        uVar33 = *puVar45 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        puVar25 = puVar45 + 0x20;
        uVar43 = (ulong)pUVar12[uVar33];
        puVar35 = (ulong *)(pBVar11 + uVar43);
        lVar42 = -(ulong)uVar38;
        uVar39 = 1;
        uVar40 = *puVar45;
        while( true ) {
          puVar18 = puVar29;
          uVar24 = uVar40 * -0x30e44323405a9d00 >> (bVar21 & 0x3f);
          uVar9 = pUVar13[uVar24];
          uVar41 = (ulong)uVar9;
          UVar27 = (int)puVar45 - iVar44;
          pUVar13[uVar24] = UVar27;
          pUVar12[uVar33] = UVar27;
          if ((uVar38 != 0) && (*(int *)((long)puVar45 + lVar42 + 1) == *(int *)((long)puVar45 + 1))
             ) {
            puVar29 = (ulong *)((long)puVar45 + 5);
            puVar35 = (ulong *)((long)puVar45 + lVar42 + 5);
            puVar25 = puVar29;
            if (puVar1 <= puVar29) goto LAB_001c3438;
            if (*puVar35 != *puVar29) {
              uVar33 = *puVar29 ^ *puVar35;
              uVar40 = 0;
              if (uVar33 != 0) {
                for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              uVar40 = uVar40 >> 3 & 0x1fffffff;
              goto LAB_001c3482;
            }
            lVar36 = 0;
            goto LAB_001c3273;
          }
          uVar24 = *puVar18;
          uVar33 = uVar24 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
          if ((uVar23 < (uint)uVar43) && (*puVar35 == uVar40)) {
            puVar29 = puVar45 + 1;
            puVar25 = puVar35 + 1;
            puVar47 = puVar29;
            if (puVar1 <= puVar29) goto LAB_001c3619;
            if (*puVar25 != *puVar29) {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
              goto LAB_001c366d;
            }
            lVar42 = 0;
            goto LAB_001c32db;
          }
          uVar43 = (ulong)pUVar12[uVar33];
          puVar35 = (ulong *)(pBVar11 + uVar43);
          if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar11 + uVar41), *piVar22 == (int)*puVar45))
          break;
          if (puVar25 <= puVar18) {
            uVar39 = uVar39 + 1;
            puVar25 = puVar25 + 0x20;
          }
          puVar29 = (ulong *)((long)puVar18 + uVar39);
          uVar40 = uVar24;
          puVar45 = puVar18;
          if (puVar17 < (ulong *)((long)puVar18 + uVar39)) goto LAB_001c6157;
        }
        if ((uVar23 < pUVar12[uVar33]) && (*puVar35 == uVar24)) {
          puVar45 = puVar18 + 1;
          puVar29 = puVar35 + 1;
          puVar25 = puVar45;
          if (puVar45 < puVar1) {
            if (*puVar29 == *puVar45) {
              lVar42 = 0;
              do {
                puVar29 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                if (puVar1 <= puVar29) {
                  puVar29 = (ulong *)(pBVar11 + lVar42 + uVar43 + 0x10);
                  puVar25 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                  goto LAB_001c37a8;
                }
                lVar36 = lVar42 + uVar43 + 0x10;
                uVar46 = *puVar29;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_e0 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar45 ^ *puVar29;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c37a8:
            if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 4);
              puVar29 = (ulong *)((long)puVar29 + 4);
            }
            if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
              puVar25 = (ulong *)((long)puVar25 + 2);
              puVar29 = (ulong *)((long)puVar29 + 2);
            }
            if (puVar25 < puVar5) {
              puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
            }
            local_e0 = (long)puVar25 - (long)puVar45;
          }
          local_e0 = local_e0 + 8;
          uVar24 = (long)puVar18 - (long)puVar35;
          puVar45 = puVar18;
          if (src < puVar18) {
            puVar29 = (ulong *)(pBVar11 + (uVar43 - 1));
            do {
              puVar25 = (ulong *)((long)puVar45 + -1);
              if ((*(char *)puVar25 != (char)*puVar29) ||
                 (local_e0 = local_e0 + 1, puVar45 = puVar25, puVar25 <= src)) break;
              bVar15 = puVar28 < puVar29;
              puVar29 = (ulong *)((long)puVar29 + -1);
            } while (bVar15);
          }
        }
        else {
          puVar29 = (ulong *)((long)puVar45 + 4);
          puVar25 = (ulong *)(piVar22 + 1);
          puVar35 = puVar29;
          if (puVar29 < puVar1) {
            if (*puVar25 == *puVar29) {
              lVar42 = 0;
              do {
                puVar25 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                if (puVar1 <= puVar25) {
                  puVar25 = (ulong *)(pBVar11 + lVar42 + uVar41 + 0xc);
                  puVar35 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                  goto LAB_001c36e3;
                }
                lVar36 = lVar42 + uVar41 + 0xc;
                uVar46 = *puVar25;
                lVar42 = lVar42 + 8;
              } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
              uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
              uVar40 = 0;
              if (uVar46 != 0) {
                for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                }
              }
              local_e0 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
            }
            else {
              uVar40 = *puVar29 ^ *puVar25;
              uVar46 = 0;
              if (uVar40 != 0) {
                for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
                }
              }
              local_e0 = uVar46 >> 3 & 0x1fffffff;
            }
          }
          else {
LAB_001c36e3:
            if ((puVar35 < puVar2) && ((int)*puVar25 == (int)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 4);
              puVar25 = (ulong *)((long)puVar25 + 4);
            }
            if ((puVar35 < puVar3) && ((short)*puVar25 == (short)*puVar35)) {
              puVar35 = (ulong *)((long)puVar35 + 2);
              puVar25 = (ulong *)((long)puVar25 + 2);
            }
            if (puVar35 < puVar5) {
              puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar25 == (char)*puVar35));
            }
            local_e0 = (long)puVar35 - (long)puVar29;
          }
          local_e0 = local_e0 + 4;
          uVar24 = (long)puVar45 - (long)piVar22;
          if (src < puVar45) {
            puVar29 = (ulong *)(pBVar11 + (uVar41 - 1));
            do {
              puVar25 = (ulong *)((long)puVar45 + -1);
              if ((*(char *)puVar25 != (char)*puVar29) ||
                 (local_e0 = local_e0 + 1, puVar45 = puVar25, puVar25 <= src)) break;
              bVar15 = puVar28 < puVar29;
              puVar29 = (ulong *)((long)puVar29 + -1);
            } while (bVar15);
          }
        }
        goto LAB_001c384b;
      }
LAB_001c6274:
      __assert_fail("hBits <= 32",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                    ,0x342,"size_t ZSTD_hashPtr(const void *, U32, U32)");
    }
  }
  else if (puVar29 <= puVar17) {
    uVar37 = (ms->cParams).hashLog;
    if ((uVar37 < 0x21) && (uVar9 = (ms->cParams).chainLog, uVar9 < 0x21)) {
      bVar20 = 0x40 - (char)uVar37;
      bVar21 = 0x20 - (char)uVar9;
      puVar1 = (ulong *)((long)puVar5 - 7);
      puVar2 = (ulong *)((long)puVar5 - 3);
      puVar3 = (ulong *)((long)puVar5 - 1);
      puVar4 = puVar5 + -4;
LAB_001c55a6:
      uVar37 = (uint)uVar46;
      uVar40 = *puVar45;
      uVar33 = uVar40 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
      puVar25 = puVar45 + 0x20;
      uVar39 = (ulong)pUVar12[uVar33];
      puVar35 = (ulong *)(pBVar11 + uVar39);
      lVar42 = -(ulong)uVar38;
      uVar43 = 1;
      while( true ) {
        puVar18 = puVar29;
        uVar31 = (uint)((int)uVar40 * -0x61c8864f) >> (bVar21 & 0x1f);
        uVar9 = pUVar13[uVar31];
        uVar24 = (ulong)uVar9;
        UVar27 = (int)puVar45 - iVar44;
        pUVar13[uVar31] = UVar27;
        pUVar12[uVar33] = UVar27;
        if ((uVar38 != 0) && (*(int *)((long)puVar45 + lVar42 + 1) == *(int *)((long)puVar45 + 1)))
        {
          puVar29 = (ulong *)((long)puVar45 + 5);
          puVar35 = (ulong *)((long)puVar45 + lVar42 + 5);
          puVar25 = puVar29;
          if (puVar1 <= puVar29) goto LAB_001c58c6;
          if (*puVar35 != *puVar29) {
            uVar33 = *puVar29 ^ *puVar35;
            uVar40 = 0;
            if (uVar33 != 0) {
              for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            uVar40 = uVar40 >> 3 & 0x1fffffff;
            goto LAB_001c5910;
          }
          lVar36 = 0;
          goto LAB_001c56fa;
        }
        uVar40 = *puVar18;
        uVar33 = uVar40 * -0x30e44323485a9b9d >> (bVar20 & 0x3f);
        if ((uVar23 < (uint)uVar39) && (*puVar35 == *puVar45)) {
          puVar29 = puVar45 + 1;
          puVar25 = puVar35 + 1;
          puVar47 = puVar29;
          if (puVar1 <= puVar29) goto LAB_001c5aa4;
          if (*puVar25 != *puVar29) {
            uVar40 = *puVar29 ^ *puVar25;
            uVar46 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar41 = uVar46 >> 3 & 0x1fffffff;
            goto LAB_001c5b05;
          }
          lVar42 = 0;
          goto LAB_001c5765;
        }
        uVar39 = (ulong)pUVar12[uVar33];
        puVar35 = (ulong *)(pBVar11 + uVar39);
        if ((uVar23 < uVar9) && (piVar22 = (int *)(pBVar11 + uVar24), *piVar22 == (int)*puVar45))
        break;
        if (puVar25 <= puVar18) {
          uVar43 = uVar43 + 1;
          puVar25 = puVar25 + 0x20;
        }
        puVar29 = (ulong *)((long)puVar18 + uVar43);
        puVar45 = puVar18;
        if (puVar17 < (ulong *)((long)puVar18 + uVar43)) goto LAB_001c6157;
      }
      if ((uVar23 < pUVar12[uVar33]) && (*puVar35 == uVar40)) {
        puVar45 = puVar18 + 1;
        puVar29 = puVar35 + 1;
        puVar25 = puVar45;
        if (puVar45 < puVar1) {
          if (*puVar29 == *puVar45) {
            lVar42 = 0;
            do {
              puVar29 = (ulong *)((long)puVar18 + lVar42 + 0x10);
              if (puVar1 <= puVar29) {
                puVar29 = (ulong *)(pBVar11 + lVar42 + uVar39 + 0x10);
                puVar25 = (ulong *)((long)puVar18 + lVar42 + 0x10);
                goto LAB_001c5c55;
              }
              lVar36 = lVar42 + uVar39 + 0x10;
              uVar46 = *puVar29;
              lVar42 = lVar42 + 8;
            } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
            uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
            uVar40 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            uVar41 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
          }
          else {
            uVar40 = *puVar45 ^ *puVar29;
            uVar46 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar41 = uVar46 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001c5c55:
          if ((puVar25 < puVar2) && ((int)*puVar29 == (int)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 4);
            puVar29 = (ulong *)((long)puVar29 + 4);
          }
          if ((puVar25 < puVar3) && ((short)*puVar29 == (short)*puVar25)) {
            puVar25 = (ulong *)((long)puVar25 + 2);
            puVar29 = (ulong *)((long)puVar29 + 2);
          }
          if (puVar25 < puVar5) {
            puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar29 == (char)*puVar25));
          }
          uVar41 = (long)puVar25 - (long)puVar45;
        }
        uVar41 = uVar41 + 8;
        uVar32 = (long)puVar18 - (long)puVar35;
        puVar45 = puVar18;
        if (src < puVar18) {
          puVar29 = (ulong *)(pBVar11 + (uVar39 - 1));
          do {
            puVar25 = (ulong *)((long)puVar45 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (uVar41 = uVar41 + 1, puVar45 = puVar25, puVar25 <= src)) break;
            bVar15 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar15);
        }
      }
      else {
        puVar29 = (ulong *)((long)puVar45 + 4);
        puVar25 = (ulong *)(piVar22 + 1);
        puVar35 = puVar29;
        if (puVar29 < puVar1) {
          if (*puVar25 == *puVar29) {
            lVar42 = 0;
            do {
              puVar25 = (ulong *)((long)puVar45 + lVar42 + 0xc);
              if (puVar1 <= puVar25) {
                puVar25 = (ulong *)(pBVar11 + lVar42 + uVar24 + 0xc);
                puVar35 = (ulong *)((long)puVar45 + lVar42 + 0xc);
                goto LAB_001c5b75;
              }
              lVar36 = lVar42 + uVar24 + 0xc;
              uVar46 = *puVar25;
              lVar42 = lVar42 + 8;
            } while (*(ulong *)(pBVar11 + lVar36) == uVar46);
            uVar46 = uVar46 ^ *(ulong *)(pBVar11 + lVar36);
            uVar40 = 0;
            if (uVar46 != 0) {
              for (; (uVar46 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
              }
            }
            uVar41 = (uVar40 >> 3 & 0x1fffffff) + lVar42;
          }
          else {
            uVar40 = *puVar29 ^ *puVar25;
            uVar46 = 0;
            if (uVar40 != 0) {
              for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
              }
            }
            uVar41 = uVar46 >> 3 & 0x1fffffff;
          }
        }
        else {
LAB_001c5b75:
          if ((puVar35 < puVar2) && ((int)*puVar25 == (int)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 4);
            puVar25 = (ulong *)((long)puVar25 + 4);
          }
          if ((puVar35 < puVar3) && ((short)*puVar25 == (short)*puVar35)) {
            puVar35 = (ulong *)((long)puVar35 + 2);
            puVar25 = (ulong *)((long)puVar25 + 2);
          }
          if (puVar35 < puVar5) {
            puVar35 = (ulong *)((long)puVar35 + (ulong)((char)*puVar25 == (char)*puVar35));
          }
          uVar41 = (long)puVar35 - (long)puVar29;
        }
        uVar41 = uVar41 + 4;
        uVar32 = (long)puVar45 - (long)piVar22;
        if (src < puVar45) {
          puVar29 = (ulong *)(pBVar11 + (uVar24 - 1));
          do {
            puVar25 = (ulong *)((long)puVar45 + -1);
            if ((*(char *)puVar25 != (char)*puVar29) ||
               (uVar41 = uVar41 + 1, puVar45 = puVar25, puVar25 <= src)) break;
            bVar15 = puVar28 < puVar29;
            puVar29 = (ulong *)((long)puVar29 + -1);
          } while (bVar15);
        }
      }
      goto LAB_001c5d0a;
    }
    goto LAB_001c6274;
  }
LAB_001c6157:
  if (uVar34 <= uVar30) {
    uVar34 = 0;
  }
  uVar23 = uVar34;
  if (uVar38 != 0) {
    uVar23 = uVar8;
  }
  if (uVar8 <= uVar30) {
    uVar23 = uVar34;
    uVar8 = 0;
  }
  if (uVar38 != 0) {
    uVar8 = uVar38;
  }
  if (uVar37 != 0) {
    uVar23 = uVar37;
  }
  *rep = uVar8;
  rep[1] = uVar23;
  return (long)puVar5 - (long)src;
LAB_001c4aea:
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
  if (puVar25 < puVar1) goto code_r0x001c4af7;
  puVar35 = (ulong *)((long)puVar45 + lVar42 + lVar36 + 0xd);
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
LAB_001c4cb4:
  if ((puVar25 < puVar2) && ((int)*puVar35 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar35 = (ulong *)((long)puVar35 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar35 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar35 = (ulong *)((long)puVar35 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar35 == (char)*puVar25));
  }
  uVar40 = (long)puVar25 - (long)puVar29;
  goto LAB_001c4cfe;
code_r0x001c4af7:
  uVar40 = *(ulong *)((long)puVar45 + lVar36 + lVar42 + 0xd);
  uVar33 = *puVar25;
  lVar36 = lVar36 + 8;
  if (uVar40 != uVar33) goto code_r0x001c4b07;
  goto LAB_001c4aea;
code_r0x001c4b07:
  uVar33 = uVar33 ^ uVar40;
  uVar40 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
    }
  }
  uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar36;
LAB_001c4cfe:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001c61d9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
  puVar45 = (ulong *)((long)puVar45 + 1);
  uVar33 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar33)) goto LAB_001c6236;
  if (puVar5 < puVar45) goto LAB_001c61ba;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_001c4d6e:
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c62b2;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar43 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar43;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar33) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001c62d1;
      uVar43 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar43;
      if (0x20 < (long)uVar33) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar33);
      }
      goto LAB_001c4d6e;
    }
    seqStore->lit = pBVar14 + uVar33;
  }
  local_88 = uVar40 + 4;
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar33;
  psVar19->offBase = 1;
  if (local_88 < 3) goto LAB_001c6217;
  uVar40 = uVar40 + 1;
  if (0xffff < uVar40) {
    ZVar10 = seqStore->longLengthType;
    goto joined_r0x001c4e53;
  }
  goto LAB_001c523b;
LAB_001c4b57:
  puVar25 = (ulong *)((long)puVar45 + lVar42 + 0x10);
  if (puVar25 < puVar1) goto code_r0x001c4b64;
  puVar25 = (ulong *)((long)puVar35 + lVar42 + 0x10);
  puVar47 = (ulong *)((long)puVar45 + lVar42 + 0x10);
LAB_001c4e90:
  if ((puVar47 < puVar2) && ((int)*puVar25 == (int)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar47 < puVar3) && ((short)*puVar25 == (short)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar47 < puVar5) {
    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar25 == (char)*puVar47));
  }
  local_88 = (long)puVar47 - (long)puVar29;
  goto LAB_001c4edf;
code_r0x001c4b64:
  uVar46 = *(ulong *)((long)puVar35 + lVar42 + 0x10);
  uVar40 = *puVar25;
  lVar42 = lVar42 + 8;
  if (uVar46 != uVar40) goto code_r0x001c4b75;
  goto LAB_001c4b57;
code_r0x001c4b75:
  uVar40 = uVar40 ^ uVar46;
  uVar46 = 0;
  if (uVar40 != 0) {
    for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
    }
  }
  local_88 = (uVar46 >> 3 & 0x1fffffff) + lVar42;
LAB_001c4edf:
  local_88 = local_88 + 8;
  uVar24 = (long)puVar45 - (long)puVar35;
  if ((puVar28 < puVar35) && (src < puVar45)) {
    while( true ) {
      puVar35 = (ulong *)((long)puVar35 + -1);
      puVar29 = (ulong *)((long)puVar45 + -1);
      if (*(char *)puVar29 != *(char *)puVar35) break;
      local_88 = local_88 + 1;
      puVar45 = puVar29;
      if ((puVar29 <= src) || (puVar35 <= puVar28)) break;
    }
  }
LAB_001c50b1:
  if (uVar39 < 4) {
    pUVar12[uVar33] = (int)puVar18 - iVar44;
  }
  uVar37 = (uint)uVar24;
  if (uVar37 == 0) goto LAB_001c6293;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001c61d9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
  uVar46 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar46)) goto LAB_001c6236;
  if (puVar5 < puVar45) goto LAB_001c61ba;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_001c513c:
    seqStore->lit = seqStore->lit + uVar46;
    if (0xffff < uVar46) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c62b2;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar40;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar46) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001c62d1;
      uVar40 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar40;
      if (0x20 < (long)uVar46) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar46);
      }
      goto LAB_001c513c;
    }
    seqStore->lit = pBVar14 + uVar46;
  }
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar46;
  psVar19->offBase = uVar37 + 3;
  if (local_88 < 3) goto LAB_001c6217;
  uVar40 = local_88 - 3;
  if (uVar40 < 0x10000) {
    uVar46 = (ulong)uVar38;
    goto LAB_001c5242;
  }
  ZVar10 = seqStore->longLengthType;
  uVar46 = (ulong)uVar38;
  uVar38 = uVar37;
joined_r0x001c4e53:
  if (ZVar10 != ZSTD_llt_none) goto LAB_001c6255;
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
LAB_001c523b:
  uVar24 = (ulong)uVar38;
LAB_001c5242:
  src = (void *)((long)puVar45 + local_88);
  psVar19->mlBase = (U16)uVar40;
  psVar19 = psVar19 + 1;
  seqStore->sequences = psVar19;
  if (puVar17 < src) {
    uVar38 = (uint)uVar24;
  }
  else {
    uVar37 = UVar27 + 2;
    lVar42 = *(long *)(pBVar11 + uVar37);
    pUVar12[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar37;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)src + -2) - iVar44;
    pUVar13[(ulong)(lVar42 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = uVar37;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e4432345000000) >> (bVar21 & 0x3f)] =
         ((int)src + -1) - iVar44;
    uVar40 = uVar46;
    do {
      uVar37 = (uint)uVar40;
      uVar33 = uVar24 & 0xffffffff;
      uVar46 = uVar40;
      uVar38 = (uint)uVar24;
      if ((uVar37 == 0) || ((int)*src != *(int *)((long)src - uVar40))) break;
      lVar42 = -uVar40;
      puVar45 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar42 + 4);
      puVar29 = puVar45;
      if (puVar45 < puVar1) {
        if (*puVar25 == *puVar45) {
          lVar36 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar36 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar42 + lVar36 + 0xc);
              puVar29 = (ulong *)((long)src + lVar36 + 0xc);
              goto LAB_001c539b;
            }
            uVar46 = *(ulong *)((long)src + lVar36 + lVar42 + 0xc);
            uVar43 = *puVar29;
            lVar36 = lVar36 + 8;
          } while (uVar46 == uVar43);
          uVar43 = uVar43 ^ uVar46;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar43 = *puVar45 ^ *puVar25;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = uVar46 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001c539b:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar46 = (long)puVar29 - (long)puVar45;
      }
      UVar27 = (int)src - iVar44;
      uVar43 = *src;
      pUVar13[uVar43 * -0x30e4432345000000 >> (bVar21 & 0x3f)] = UVar27;
      pUVar12[uVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar27;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001c61d9;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
      puVar45 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar45) goto LAB_001c6236;
      if (puVar5 < src) goto LAB_001c61ba;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar45,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar43 = *(ulong *)((long)src + 8);
        *puVar45 = *src;
        puVar45[1] = uVar43;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (uVar46 + 4 < 3) goto LAB_001c6217;
      if (0xffff < uVar46 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c6255;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(uVar46 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      src = (void *)((long)src + uVar46 + 4);
      uVar46 = uVar33;
      uVar24 = uVar40;
      uVar40 = uVar33;
      uVar38 = uVar37;
    } while (src <= puVar17);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar37 = (uint)uVar46;
  puVar45 = (ulong *)src;
  if (puVar17 < puVar29) goto LAB_001c6157;
  goto LAB_001c4994;
LAB_001c3eb2:
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
  if (puVar25 < puVar1) goto code_r0x001c3ebf;
  puVar35 = (ulong *)((long)puVar45 + lVar42 + lVar36 + 0xd);
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
LAB_001c4077:
  if ((puVar25 < puVar2) && ((int)*puVar35 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar35 = (ulong *)((long)puVar35 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar35 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar35 = (ulong *)((long)puVar35 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar35 == (char)*puVar25));
  }
  uVar40 = (long)puVar25 - (long)puVar29;
  goto LAB_001c40c1;
code_r0x001c3ebf:
  uVar40 = *(ulong *)((long)puVar45 + lVar36 + lVar42 + 0xd);
  uVar33 = *puVar25;
  lVar36 = lVar36 + 8;
  if (uVar40 != uVar33) goto code_r0x001c3ecf;
  goto LAB_001c3eb2;
code_r0x001c3ecf:
  uVar33 = uVar33 ^ uVar40;
  uVar40 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
    }
  }
  uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar36;
LAB_001c40c1:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001c61d9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
  puVar45 = (ulong *)((long)puVar45 + 1);
  uVar33 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar33)) goto LAB_001c6236;
  if (puVar5 < puVar45) goto LAB_001c61ba;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_001c4131:
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c62b2;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar43 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar43;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar33) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001c62d1;
      uVar43 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar43;
      if (0x20 < (long)uVar33) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar33);
      }
      goto LAB_001c4131;
    }
    seqStore->lit = pBVar14 + uVar33;
  }
  local_e0 = uVar40 + 4;
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar33;
  psVar19->offBase = 1;
  if (local_e0 < 3) goto LAB_001c6217;
  uVar40 = uVar40 + 1;
  if (0xffff < uVar40) {
    ZVar10 = seqStore->longLengthType;
    goto joined_r0x001c4216;
  }
  goto LAB_001c460f;
LAB_001c3f1a:
  puVar25 = (ulong *)((long)puVar45 + lVar42 + 0x10);
  if (puVar25 < puVar1) goto code_r0x001c3f27;
  puVar25 = (ulong *)((long)puVar35 + lVar42 + 0x10);
  puVar47 = (ulong *)((long)puVar45 + lVar42 + 0x10);
LAB_001c4258:
  if ((puVar47 < puVar2) && ((int)*puVar25 == (int)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar47 < puVar3) && ((short)*puVar25 == (short)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar47 < puVar5) {
    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar25 == (char)*puVar47));
  }
  local_e0 = (long)puVar47 - (long)puVar29;
  goto LAB_001c42ac;
code_r0x001c3f27:
  uVar46 = *(ulong *)((long)puVar35 + lVar42 + 0x10);
  uVar40 = *puVar25;
  lVar42 = lVar42 + 8;
  if (uVar46 != uVar40) goto code_r0x001c3f38;
  goto LAB_001c3f1a;
code_r0x001c3f38:
  uVar40 = uVar40 ^ uVar46;
  uVar46 = 0;
  if (uVar40 != 0) {
    for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
    }
  }
  local_e0 = (uVar46 >> 3 & 0x1fffffff) + lVar42;
LAB_001c42ac:
  local_e0 = local_e0 + 8;
  uVar24 = (long)puVar45 - (long)puVar35;
  if ((puVar28 < puVar35) && (src < puVar45)) {
    while( true ) {
      puVar35 = (ulong *)((long)puVar35 + -1);
      puVar29 = (ulong *)((long)puVar45 + -1);
      if (*(char *)puVar29 != *(char *)puVar35) break;
      local_e0 = local_e0 + 1;
      puVar45 = puVar29;
      if ((puVar29 <= src) || (puVar35 <= puVar28)) break;
    }
  }
LAB_001c448a:
  if (uVar39 < 4) {
    pUVar12[uVar33] = (int)puVar18 - iVar44;
  }
  uVar37 = (uint)uVar24;
  if (uVar37 == 0) goto LAB_001c6293;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001c61d9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
  uVar46 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar46)) goto LAB_001c6236;
  if (puVar5 < puVar45) goto LAB_001c61ba;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_001c4510:
    seqStore->lit = seqStore->lit + uVar46;
    if (0xffff < uVar46) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c62b2;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar40;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar46) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001c62d1;
      uVar40 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar40;
      if (0x20 < (long)uVar46) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar46);
      }
      goto LAB_001c4510;
    }
    seqStore->lit = pBVar14 + uVar46;
  }
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar46;
  psVar19->offBase = uVar37 + 3;
  if (local_e0 < 3) goto LAB_001c6217;
  uVar40 = local_e0 - 3;
  if (uVar40 < 0x10000) {
    uVar46 = (ulong)uVar38;
    goto LAB_001c4616;
  }
  ZVar10 = seqStore->longLengthType;
  uVar46 = (ulong)uVar38;
  uVar38 = uVar37;
joined_r0x001c4216:
  if (ZVar10 != ZSTD_llt_none) goto LAB_001c6255;
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
LAB_001c460f:
  uVar24 = (ulong)uVar38;
LAB_001c4616:
  src = (void *)((long)puVar45 + local_e0);
  psVar19->mlBase = (U16)uVar40;
  psVar19 = psVar19 + 1;
  seqStore->sequences = psVar19;
  if (puVar17 < src) {
    uVar38 = (uint)uVar24;
  }
  else {
    uVar37 = UVar27 + 2;
    lVar42 = *(long *)(pBVar11 + uVar37);
    pUVar12[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar37;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)src + -2) - iVar44;
    pUVar13[(ulong)(lVar42 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = uVar37;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e4432340650000) >> (bVar21 & 0x3f)] =
         ((int)src + -1) - iVar44;
    uVar40 = uVar46;
    do {
      uVar37 = (uint)uVar40;
      uVar33 = uVar24 & 0xffffffff;
      uVar46 = uVar40;
      uVar38 = (uint)uVar24;
      if ((uVar37 == 0) || ((int)*src != *(int *)((long)src - uVar40))) break;
      lVar42 = -uVar40;
      puVar45 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar42 + 4);
      puVar29 = puVar45;
      if (puVar45 < puVar1) {
        if (*puVar25 == *puVar45) {
          lVar36 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar36 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar42 + lVar36 + 0xc);
              puVar29 = (ulong *)((long)src + lVar36 + 0xc);
              goto LAB_001c476f;
            }
            uVar46 = *(ulong *)((long)src + lVar36 + lVar42 + 0xc);
            uVar43 = *puVar29;
            lVar36 = lVar36 + 8;
          } while (uVar46 == uVar43);
          uVar43 = uVar43 ^ uVar46;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar43 = *puVar45 ^ *puVar25;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = uVar46 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001c476f:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar46 = (long)puVar29 - (long)puVar45;
      }
      UVar27 = (int)src - iVar44;
      uVar43 = *src;
      pUVar13[uVar43 * -0x30e4432340650000 >> (bVar21 & 0x3f)] = UVar27;
      pUVar12[uVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar27;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001c61d9;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
      puVar45 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar45) goto LAB_001c6236;
      if (puVar5 < src) goto LAB_001c61ba;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar45,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar43 = *(ulong *)((long)src + 8);
        *puVar45 = *src;
        puVar45[1] = uVar43;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (uVar46 + 4 < 3) goto LAB_001c6217;
      if (0xffff < uVar46 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c6255;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(uVar46 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      src = (void *)((long)src + uVar46 + 4);
      uVar46 = uVar33;
      uVar24 = uVar40;
      uVar40 = uVar33;
      uVar38 = uVar37;
    } while (src <= puVar17);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar37 = (uint)uVar46;
  puVar45 = (ulong *)src;
  if (puVar17 < puVar29) goto LAB_001c6157;
  goto LAB_001c3d50;
LAB_001c56fa:
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
  if (puVar25 < puVar1) goto code_r0x001c5709;
  puVar35 = (ulong *)((long)puVar45 + lVar42 + lVar36 + 0xd);
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
LAB_001c58c6:
  if ((puVar25 < puVar2) && ((int)*puVar35 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar35 = (ulong *)((long)puVar35 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar35 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar35 = (ulong *)((long)puVar35 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar35 == (char)*puVar25));
  }
  uVar40 = (long)puVar25 - (long)puVar29;
  goto LAB_001c5910;
code_r0x001c5709:
  uVar40 = *(ulong *)((long)puVar45 + lVar36 + lVar42 + 0xd);
  uVar33 = *puVar25;
  lVar36 = lVar36 + 8;
  if (uVar40 != uVar33) goto code_r0x001c5719;
  goto LAB_001c56fa;
code_r0x001c5719:
  uVar33 = uVar33 ^ uVar40;
  uVar40 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
    }
  }
  uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar36;
LAB_001c5910:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001c61d9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
  puVar45 = (ulong *)((long)puVar45 + 1);
  uVar33 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar33)) goto LAB_001c6236;
  if (puVar5 < puVar45) goto LAB_001c61ba;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_001c5980:
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c62b2;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar43 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar43;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar33) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001c62d1;
      uVar43 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar43;
      if (0x20 < (long)uVar33) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar33);
      }
      goto LAB_001c5980;
    }
    seqStore->lit = pBVar14 + uVar33;
  }
  uVar41 = uVar40 + 4;
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar33;
  psVar19->offBase = 1;
  if (uVar41 < 3) goto LAB_001c6217;
  uVar40 = uVar40 + 1;
  if (0xffff < uVar40) {
    ZVar10 = seqStore->longLengthType;
    goto joined_r0x001c5a60;
  }
  goto LAB_001c5e8b;
LAB_001c5765:
  puVar25 = (ulong *)((long)puVar45 + lVar42 + 0x10);
  if (puVar25 < puVar1) goto code_r0x001c5774;
  puVar25 = (ulong *)((long)puVar35 + lVar42 + 0x10);
  puVar47 = (ulong *)((long)puVar45 + lVar42 + 0x10);
LAB_001c5aa4:
  if ((puVar47 < puVar2) && ((int)*puVar25 == (int)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar47 < puVar3) && ((short)*puVar25 == (short)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar47 < puVar5) {
    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar25 == (char)*puVar47));
  }
  uVar41 = (long)puVar47 - (long)puVar29;
  goto LAB_001c5b05;
code_r0x001c5774:
  uVar46 = *(ulong *)((long)puVar35 + lVar42 + 0x10);
  uVar40 = *puVar25;
  lVar42 = lVar42 + 8;
  if (uVar46 != uVar40) goto code_r0x001c5785;
  goto LAB_001c5765;
code_r0x001c5785:
  uVar40 = uVar40 ^ uVar46;
  uVar46 = 0;
  if (uVar40 != 0) {
    for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
    }
  }
  uVar41 = (uVar46 >> 3 & 0x1fffffff) + lVar42;
LAB_001c5b05:
  uVar41 = uVar41 + 8;
  uVar32 = (long)puVar45 - (long)puVar35;
  if ((puVar28 < puVar35) && (src < puVar45)) {
    while( true ) {
      puVar35 = (ulong *)((long)puVar35 + -1);
      puVar29 = (ulong *)((long)puVar45 + -1);
      if (*(char *)puVar29 != *(char *)puVar35) break;
      uVar41 = uVar41 + 1;
      puVar45 = puVar29;
      if ((puVar29 <= src) || (puVar35 <= puVar28)) break;
    }
  }
LAB_001c5d0a:
  if (uVar43 < 4) {
    pUVar12[uVar33] = (int)puVar18 - iVar44;
  }
  uVar37 = (uint)uVar32;
  if (uVar37 == 0) goto LAB_001c6293;
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001c61d9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
  uVar46 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar46)) goto LAB_001c6236;
  if (puVar5 < puVar45) goto LAB_001c61ba;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_001c5d91:
    seqStore->lit = seqStore->lit + uVar46;
    if (0xffff < uVar46) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c62b2;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar40;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar46) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001c62d1;
      uVar40 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar40;
      if (0x20 < (long)uVar46) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar46);
      }
      goto LAB_001c5d91;
    }
    seqStore->lit = pBVar14 + uVar46;
  }
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar46;
  psVar19->offBase = uVar37 + 3;
  if (uVar41 < 3) goto LAB_001c6217;
  uVar40 = uVar41 - 3;
  if (uVar40 < 0x10000) {
    uVar46 = (ulong)uVar38;
    goto LAB_001c5e92;
  }
  ZVar10 = seqStore->longLengthType;
  uVar46 = (ulong)uVar38;
  uVar38 = uVar37;
joined_r0x001c5a60:
  if (ZVar10 != ZSTD_llt_none) goto LAB_001c6255;
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
LAB_001c5e8b:
  uVar32 = (ulong)uVar38;
LAB_001c5e92:
  src = (void *)((long)puVar45 + uVar41);
  psVar19->mlBase = (U16)uVar40;
  psVar19 = psVar19 + 1;
  seqStore->sequences = psVar19;
  if (puVar17 < src) {
    uVar38 = (uint)uVar32;
  }
  else {
    uVar37 = UVar27 + 2;
    pUVar12[(ulong)(*(long *)(pBVar11 + uVar37) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar37;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)src + -2) - iVar44;
    pUVar13[(uint)(*(int *)(pBVar11 + uVar37) * -0x61c8864f) >> (bVar21 & 0x1f)] = uVar37;
    pUVar13[(uint)(*(int *)((long)src + -1) * -0x61c8864f) >> (bVar21 & 0x1f)] =
         ((int)src + -1) - iVar44;
    uVar40 = uVar46;
    do {
      uVar37 = (uint)uVar40;
      uVar33 = uVar32 & 0xffffffff;
      uVar46 = uVar40;
      uVar38 = (uint)uVar32;
      if ((uVar37 == 0) || ((int)*src != *(int *)((long)src - uVar40))) break;
      lVar42 = -uVar40;
      puVar45 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar42 + 4);
      puVar29 = puVar45;
      if (puVar45 < puVar1) {
        if (*puVar25 == *puVar45) {
          lVar36 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar36 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar42 + lVar36 + 0xc);
              puVar29 = (ulong *)((long)src + lVar36 + 0xc);
              goto LAB_001c5fe1;
            }
            uVar46 = *(ulong *)((long)src + lVar36 + lVar42 + 0xc);
            uVar43 = *puVar29;
            lVar36 = lVar36 + 8;
          } while (uVar46 == uVar43);
          uVar43 = uVar43 ^ uVar46;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar43 = *puVar45 ^ *puVar25;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = uVar46 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001c5fe1:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar46 = (long)puVar29 - (long)puVar45;
      }
      UVar27 = (int)src - iVar44;
      pUVar13[(uint)((int)*src * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar27;
      pUVar12[*src * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar27;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001c61d9;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
      puVar45 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar45) goto LAB_001c6236;
      if (puVar5 < src) goto LAB_001c61ba;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar45,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar43 = *(ulong *)((long)src + 8);
        *puVar45 = *src;
        puVar45[1] = uVar43;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (uVar46 + 4 < 3) goto LAB_001c6217;
      if (0xffff < uVar46 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c6255;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(uVar46 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      src = (void *)((long)src + uVar46 + 4);
      uVar46 = uVar33;
      uVar32 = uVar40;
      uVar40 = uVar33;
      uVar38 = uVar37;
    } while (src <= puVar17);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar37 = (uint)uVar46;
  puVar45 = (ulong *)src;
  if (puVar17 < puVar29) goto LAB_001c6157;
  goto LAB_001c55a6;
LAB_001c3273:
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
  if (puVar25 < puVar1) goto code_r0x001c3280;
  puVar35 = (ulong *)((long)puVar45 + lVar42 + lVar36 + 0xd);
  puVar25 = (ulong *)((long)puVar45 + lVar36 + 0xd);
LAB_001c3438:
  if ((puVar25 < puVar2) && ((int)*puVar35 == (int)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 4);
    puVar35 = (ulong *)((long)puVar35 + 4);
  }
  if ((puVar25 < puVar3) && ((short)*puVar35 == (short)*puVar25)) {
    puVar25 = (ulong *)((long)puVar25 + 2);
    puVar35 = (ulong *)((long)puVar35 + 2);
  }
  if (puVar25 < puVar5) {
    puVar25 = (ulong *)((long)puVar25 + (ulong)((char)*puVar35 == (char)*puVar25));
  }
  uVar40 = (long)puVar25 - (long)puVar29;
  goto LAB_001c3482;
code_r0x001c3280:
  uVar40 = *(ulong *)((long)puVar45 + lVar36 + lVar42 + 0xd);
  uVar33 = *puVar25;
  lVar36 = lVar36 + 8;
  if (uVar40 != uVar33) goto code_r0x001c3290;
  goto LAB_001c3273;
code_r0x001c3290:
  uVar33 = uVar33 ^ uVar40;
  uVar40 = 0;
  if (uVar33 != 0) {
    for (; (uVar33 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
    }
  }
  uVar40 = (uVar40 >> 3 & 0x1fffffff) + lVar36;
LAB_001c3482:
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) goto LAB_001c61d9;
  if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
  puVar45 = (ulong *)((long)puVar45 + 1);
  uVar33 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar33)) goto LAB_001c6236;
  if (puVar5 < puVar45) goto LAB_001c61ba;
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_001c34f2:
    seqStore->lit = seqStore->lit + uVar33;
    if (0xffff < uVar33) {
      if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c62b2;
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar43 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar43;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar33) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10))))
      goto LAB_001c62d1;
      uVar43 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar43;
      if (0x20 < (long)uVar33) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar33);
      }
      goto LAB_001c34f2;
    }
    seqStore->lit = pBVar14 + uVar33;
  }
  local_e0 = uVar40 + 4;
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar33;
  psVar19->offBase = 1;
  if (local_e0 < 3) goto LAB_001c6217;
  uVar40 = uVar40 + 1;
  if (0xffff < uVar40) {
    ZVar10 = seqStore->longLengthType;
    goto joined_r0x001c35d7;
  }
  goto LAB_001c39d0;
LAB_001c32db:
  puVar25 = (ulong *)((long)puVar45 + lVar42 + 0x10);
  if (puVar25 < puVar1) goto code_r0x001c32e8;
  puVar25 = (ulong *)((long)puVar35 + lVar42 + 0x10);
  puVar47 = (ulong *)((long)puVar45 + lVar42 + 0x10);
LAB_001c3619:
  if ((puVar47 < puVar2) && ((int)*puVar25 == (int)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 4);
    puVar25 = (ulong *)((long)puVar25 + 4);
  }
  if ((puVar47 < puVar3) && ((short)*puVar25 == (short)*puVar47)) {
    puVar47 = (ulong *)((long)puVar47 + 2);
    puVar25 = (ulong *)((long)puVar25 + 2);
  }
  if (puVar47 < puVar5) {
    puVar47 = (ulong *)((long)puVar47 + (ulong)((char)*puVar25 == (char)*puVar47));
  }
  local_e0 = (long)puVar47 - (long)puVar29;
  goto LAB_001c366d;
code_r0x001c32e8:
  uVar46 = *(ulong *)((long)puVar35 + lVar42 + 0x10);
  uVar40 = *puVar25;
  lVar42 = lVar42 + 8;
  if (uVar46 != uVar40) goto code_r0x001c32f9;
  goto LAB_001c32db;
code_r0x001c32f9:
  uVar40 = uVar40 ^ uVar46;
  uVar46 = 0;
  if (uVar40 != 0) {
    for (; (uVar40 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
    }
  }
  local_e0 = (uVar46 >> 3 & 0x1fffffff) + lVar42;
LAB_001c366d:
  local_e0 = local_e0 + 8;
  uVar24 = (long)puVar45 - (long)puVar35;
  if ((puVar28 < puVar35) && (src < puVar45)) {
    while( true ) {
      puVar35 = (ulong *)((long)puVar35 + -1);
      puVar29 = (ulong *)((long)puVar45 + -1);
      if (*(char *)puVar29 != *(char *)puVar35) break;
      local_e0 = local_e0 + 1;
      puVar45 = puVar29;
      if ((puVar29 <= src) || (puVar35 <= puVar28)) break;
    }
  }
LAB_001c384b:
  if (uVar39 < 4) {
    pUVar12[uVar33] = (int)puVar18 - iVar44;
  }
  uVar37 = (uint)uVar24;
  if (uVar37 == 0) {
LAB_001c6293:
    __assert_fail("(offset)>0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_double_fast.c"
                  ,0x10f,
                  "size_t ZSTD_compressBlock_doubleFast_noDict_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32)"
                 );
  }
  if (seqStore->maxNbSeq <= (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3)
     ) {
LAB_001c61d9:
    __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29d,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (0x20000 < seqStore->maxNbLit) {
LAB_001c61f8:
    __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x29f,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar46 = (long)puVar45 - (long)src;
  puVar29 = (ulong *)seqStore->lit;
  if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)puVar29 + uVar46)) {
LAB_001c6236:
    __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a0,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar5 < puVar45) {
LAB_001c61ba:
    __assert_fail("literals + litLength <= litLimit",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2a1,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  if (puVar4 < puVar45) {
    ZSTD_safecopyLiterals((BYTE *)puVar29,(BYTE *)src,(BYTE *)puVar45,(BYTE *)puVar4);
LAB_001c38d1:
    seqStore->lit = seqStore->lit + uVar46;
    if (0xffff < uVar46) {
      if (seqStore->longLengthType != ZSTD_llt_none) {
LAB_001c62b2:
        __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                      ,0x2b2,
                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                     );
      }
      seqStore->longLengthType = ZSTD_llt_literalLength;
      seqStore->longLengthPos =
           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
    }
  }
  else {
    uVar40 = *(ulong *)((long)src + 8);
    *puVar29 = *src;
    puVar29[1] = uVar40;
    pBVar14 = seqStore->lit;
    if (0x10 < uVar46) {
      if (0xffffffffffffffe0 < (ulong)((long)(pBVar14 + 0x10) + (-0x10 - ((long)src + 0x10)))) {
LAB_001c62d1:
        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/../common/zstd_internal.h"
                      ,0xe9,
                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)");
      }
      uVar40 = *(ulong *)((long)src + 0x18);
      *(ulong *)(pBVar14 + 0x10) = *(ulong *)((long)src + 0x10);
      *(ulong *)(pBVar14 + 0x18) = uVar40;
      if (0x20 < (long)uVar46) {
        lVar42 = 0;
        do {
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x20);
          uVar16 = puVar7[1];
          pBVar6 = pBVar14 + lVar42 + 0x20;
          *(undefined8 *)pBVar6 = *puVar7;
          *(undefined8 *)(pBVar6 + 8) = uVar16;
          puVar7 = (undefined8 *)((long)src + lVar42 + 0x30);
          uVar16 = puVar7[1];
          *(undefined8 *)(pBVar6 + 0x10) = *puVar7;
          *(undefined8 *)(pBVar6 + 0x18) = uVar16;
          lVar42 = lVar42 + 0x20;
        } while (pBVar6 + 0x20 < pBVar14 + uVar46);
      }
      goto LAB_001c38d1;
    }
    seqStore->lit = pBVar14 + uVar46;
  }
  psVar19 = seqStore->sequences;
  psVar19->litLength = (U16)uVar46;
  psVar19->offBase = uVar37 + 3;
  if (local_e0 < 3) {
LAB_001c6217:
    __assert_fail("matchLength >= MINMATCH",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,700,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  uVar40 = local_e0 - 3;
  if (uVar40 < 0x10000) {
    uVar46 = (ulong)uVar38;
    goto LAB_001c39d7;
  }
  ZVar10 = seqStore->longLengthType;
  uVar46 = (ulong)uVar38;
  uVar38 = uVar37;
joined_r0x001c35d7:
  if (ZVar10 != ZSTD_llt_none) {
LAB_001c6255:
    __assert_fail("seqStorePtr->longLengthType == ZSTD_llt_none",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress_internal.h"
                  ,0x2bf,
                  "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                 );
  }
  seqStore->longLengthType = ZSTD_llt_matchLength;
  seqStore->longLengthPos = (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
LAB_001c39d0:
  uVar24 = (ulong)uVar38;
LAB_001c39d7:
  src = (void *)((long)puVar45 + local_e0);
  psVar19->mlBase = (U16)uVar40;
  psVar19 = psVar19 + 1;
  seqStore->sequences = psVar19;
  if (puVar17 < src) {
    uVar38 = (uint)uVar24;
  }
  else {
    uVar37 = UVar27 + 2;
    lVar42 = *(long *)(pBVar11 + uVar37);
    pUVar12[(ulong)(lVar42 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar37;
    pUVar12[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
         ((int)src + -2) - iVar44;
    pUVar13[(ulong)(lVar42 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = uVar37;
    pUVar13[(ulong)(*(long *)((long)src + -1) * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] =
         ((int)src + -1) - iVar44;
    uVar40 = uVar46;
    do {
      uVar37 = (uint)uVar40;
      uVar33 = uVar24 & 0xffffffff;
      uVar46 = uVar40;
      uVar38 = (uint)uVar24;
      if ((uVar37 == 0) || ((int)*src != *(int *)((long)src - uVar40))) break;
      lVar42 = -uVar40;
      puVar45 = (ulong *)((long)src + 4);
      puVar25 = (ulong *)((long)src + lVar42 + 4);
      puVar29 = puVar45;
      if (puVar45 < puVar1) {
        if (*puVar25 == *puVar45) {
          lVar36 = 0;
          do {
            puVar29 = (ulong *)((long)src + lVar36 + 0xc);
            if (puVar1 <= puVar29) {
              puVar25 = (ulong *)((long)src + lVar42 + lVar36 + 0xc);
              puVar29 = (ulong *)((long)src + lVar36 + 0xc);
              goto LAB_001c3b30;
            }
            uVar46 = *(ulong *)((long)src + lVar36 + lVar42 + 0xc);
            uVar43 = *puVar29;
            lVar36 = lVar36 + 8;
          } while (uVar46 == uVar43);
          uVar43 = uVar43 ^ uVar46;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = (uVar46 >> 3 & 0x1fffffff) + lVar36;
        }
        else {
          uVar43 = *puVar45 ^ *puVar25;
          uVar46 = 0;
          if (uVar43 != 0) {
            for (; (uVar43 >> uVar46 & 1) == 0; uVar46 = uVar46 + 1) {
            }
          }
          uVar46 = uVar46 >> 3 & 0x1fffffff;
        }
      }
      else {
LAB_001c3b30:
        if ((puVar29 < puVar2) && ((int)*puVar25 == (int)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 4);
          puVar25 = (ulong *)((long)puVar25 + 4);
        }
        if ((puVar29 < puVar3) && ((short)*puVar25 == (short)*puVar29)) {
          puVar29 = (ulong *)((long)puVar29 + 2);
          puVar25 = (ulong *)((long)puVar25 + 2);
        }
        if (puVar29 < puVar5) {
          puVar29 = (ulong *)((long)puVar29 + (ulong)((char)*puVar25 == (char)*puVar29));
        }
        uVar46 = (long)puVar29 - (long)puVar45;
      }
      UVar27 = (int)src - iVar44;
      uVar43 = *src;
      pUVar13[uVar43 * -0x30e44323405a9d00 >> (bVar21 & 0x3f)] = UVar27;
      pUVar12[uVar43 * -0x30e44323485a9b9d >> (bVar20 & 0x3f)] = UVar27;
      if (seqStore->maxNbSeq <= (ulong)((long)psVar19 - (long)seqStore->sequencesStart >> 3))
      goto LAB_001c61d9;
      if (0x20000 < seqStore->maxNbLit) goto LAB_001c61f8;
      puVar45 = (ulong *)seqStore->lit;
      if (seqStore->litStart + seqStore->maxNbLit < puVar45) goto LAB_001c6236;
      if (puVar5 < src) goto LAB_001c61ba;
      if (puVar4 < src) {
        ZSTD_safecopyLiterals((BYTE *)puVar45,(BYTE *)src,(BYTE *)src,(BYTE *)puVar4);
      }
      else {
        uVar43 = *(ulong *)((long)src + 8);
        *puVar45 = *src;
        puVar45[1] = uVar43;
      }
      psVar19 = seqStore->sequences;
      psVar19->litLength = 0;
      psVar19->offBase = 1;
      if (uVar46 + 4 < 3) goto LAB_001c6217;
      if (0xffff < uVar46 + 1) {
        if (seqStore->longLengthType != ZSTD_llt_none) goto LAB_001c6255;
        seqStore->longLengthType = ZSTD_llt_matchLength;
        seqStore->longLengthPos =
             (U32)((ulong)((long)psVar19 - (long)seqStore->sequencesStart) >> 3);
      }
      psVar19->mlBase = (U16)(uVar46 + 1);
      psVar19 = psVar19 + 1;
      seqStore->sequences = psVar19;
      src = (void *)((long)src + uVar46 + 4);
      uVar46 = uVar33;
      uVar24 = uVar40;
      uVar40 = uVar33;
      uVar38 = uVar37;
    } while (src <= puVar17);
  }
  puVar29 = (ulong *)((long)src + 1);
  uVar37 = (uint)uVar46;
  puVar45 = (ulong *)src;
  if (puVar17 < puVar29) goto LAB_001c6157;
  goto LAB_001c3111;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_noDict_4(ms, seqStore, rep, src, srcSize);
    case 5 :
        return ZSTD_compressBlock_doubleFast_noDict_5(ms, seqStore, rep, src, srcSize);
    case 6 :
        return ZSTD_compressBlock_doubleFast_noDict_6(ms, seqStore, rep, src, srcSize);
    case 7 :
        return ZSTD_compressBlock_doubleFast_noDict_7(ms, seqStore, rep, src, srcSize);
    }
}